

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

Nullable<CordRep_*>
absl::lts_20240722::NewTree(Nullable<const_char_*> data,size_t length,size_t alloc_hint)

{
  byte bVar1;
  Nullable<CordRep_*> pCVar2;
  CordRep *pCVar3;
  CordRep *pCVar4;
  size_t *psVar5;
  char cVar6;
  
  if (length == 0) {
    return (Nullable<CordRep_*>)0x0;
  }
  if (length < 0xff4) {
    pCVar2 = &cord_internal::CordRepFlat::NewImpl<4096ul>(length)->super_CordRep;
    ((CordRep *)&pCVar2->length)->length = length;
    memcpy(pCVar2->storage,data,length);
    return pCVar2;
  }
  pCVar3 = &cord_internal::CordRepFlat::NewImpl<4096ul>(0xff3)->super_CordRep;
  pCVar3->length = 0xff3;
  memcpy(pCVar3->storage,data,0xff3);
  bVar1 = pCVar3->tag;
  if (bVar1 < 5) {
    pCVar4 = pCVar3;
    if (bVar1 == 1) {
      pCVar4 = *(CordRep **)&pCVar3[1].refcount;
    }
    if (pCVar4->tag < 5) {
      psVar5 = (size_t *)absl::lts_20240722::cord_internal::CordRepBtree::CreateSlow(pCVar3);
      goto LAB_0010bf29;
    }
  }
  psVar5 = (size_t *)operator_new(0x40);
  *(undefined4 *)(psVar5 + 1) = 2;
  if (bVar1 == 3) {
    cVar6 = pCVar3->storage[0] + '\x01';
  }
  else {
    cVar6 = '\0';
  }
  *psVar5 = pCVar3->length;
  *(undefined1 *)((long)psVar5 + 0xc) = 3;
  *(char *)((long)psVar5 + 0xd) = cVar6;
  *(undefined2 *)((long)psVar5 + 0xe) = 0x100;
  psVar5[2] = (size_t)pCVar3;
LAB_0010bf29:
  pCVar2 = (Nullable<CordRep_*>)
           absl::lts_20240722::cord_internal::CordRepBtree::Append
                     (psVar5,length - 0xff3,data + 0xff3,0);
  return pCVar2;
}

Assistant:

static absl::Nullable<CordRep*> NewTree(absl::Nullable<const char*> data,
                                        size_t length, size_t alloc_hint) {
  if (length == 0) return nullptr;
  return NewBtree(data, length, alloc_hint);
}